

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O1

State * LiteScript::State::Load(State *__return_storage_ptr__,istream *stream,Memory *memory)

{
  vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
  *pvVar1;
  pointer *ppaVar2;
  vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_> *this;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *pvVar3;
  Variable *pVVar4;
  Variable *pVVar5;
  pointer paVar6;
  iterator __position;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *pvVar13;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *pvVar14;
  Variable *this_00;
  long lVar15;
  ulong uVar16;
  undefined1 local_b8 [16];
  Variable local_a8;
  bool local_98;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> local_88;
  vector<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>,std::allocator<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>>
  *local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  Variable *local_50;
  Variable local_48;
  ulong local_38;
  
  State(__return_storage_ptr__,memory);
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  uVar9 = std::istream::get();
  iVar10 = std::istream::get();
  __return_storage_ptr__->instr_index =
       (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff;
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  uVar9 = std::istream::get();
  iVar10 = std::istream::get();
  __return_storage_ptr__->line_num =
       (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff;
  local_50 = &__return_storage_ptr__->nsp_global;
  Variable::~Variable(local_50);
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  uVar9 = std::istream::get();
  iVar10 = std::istream::get();
  Memory::GetVariable((Nullable<LiteScript::Variable> *)local_b8,memory,
                      (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff);
  Variable::Variable(local_50,(Variable *)local_b8);
  if ((bool)(char)local_a8.obj == false) {
    Variable::~Variable((Variable *)local_b8);
  }
  pvVar14 = (__return_storage_ptr__->args_tmp).
            super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (__return_storage_ptr__->args_tmp).
           super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar13 = pvVar14;
  if (pvVar3 != pvVar14) {
    do {
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector(pvVar13);
      pvVar13 = pvVar13 + 1;
    } while (pvVar13 != pvVar3);
    (__return_storage_ptr__->args_tmp).
    super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar14;
  }
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  uVar9 = std::istream::get();
  iVar10 = std::istream::get();
  uVar7 = (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff;
  if (uVar7 != 0) {
    local_68 = (ulong)uVar7;
    local_60 = 0;
    do {
      local_b8._0_4_ = 0;
      local_b8._4_4_ = 0;
      local_b8._8_8_ = (pointer)0x0;
      local_a8.obj = (Object *)0x0;
      std::
      vector<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>,std::allocator<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>>
      ::emplace_back<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>
                ((vector<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>,std::allocator<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>>
                  *)&__return_storage_ptr__->args_tmp,
                 (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_b8);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_b8);
      uVar7 = std::istream::get();
      uVar8 = std::istream::get();
      uVar9 = std::istream::get();
      iVar10 = std::istream::get();
      uVar7 = (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff;
      local_70 = (vector<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>,std::allocator<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>>
                  *)CONCAT44(local_70._4_4_,uVar7);
      if (uVar7 != 0) {
        uVar7 = 0;
        local_58 = local_60 * 0x18;
        do {
          pvVar14 = (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                    ((long)&(((__return_storage_ptr__->args_tmp).
                              super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                            )._M_impl + local_58);
          uVar8 = std::istream::get();
          uVar9 = std::istream::get();
          uVar11 = std::istream::get();
          iVar10 = std::istream::get();
          Memory::GetVariable((Nullable<LiteScript::Variable> *)local_b8,memory,
                              (uVar11 & 0xff) << 0x10 | iVar10 << 0x18 |
                              (uVar9 & 0xff) << 8 | uVar8 & 0xff);
          Variable::Variable(&local_48,(Variable *)local_b8);
          std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
          emplace_back<LiteScript::Variable>(pvVar14,&local_48);
          Variable::~Variable(&local_48);
          if ((bool)(char)local_a8.obj == false) {
            Variable::~Variable((Variable *)local_b8);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (uint)local_70);
      }
      local_60 = local_60 + 1;
    } while (local_60 < local_68);
  }
  pvVar14 = (__return_storage_ptr__->args_tmp).
            super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (__return_storage_ptr__->args_tmp).
           super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar13 = pvVar14;
  if (pvVar3 != pvVar14) {
    do {
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector(pvVar13);
      pvVar13 = pvVar13 + 1;
    } while (pvVar13 != pvVar3);
    (__return_storage_ptr__->args_tmp).
    super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar14;
  }
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  uVar9 = std::istream::get();
  iVar10 = std::istream::get();
  uVar7 = (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff;
  if (uVar7 != 0) {
    local_70 = (vector<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>,std::allocator<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>>
                *)&__return_storage_ptr__->args_def;
    local_38 = (ulong)uVar7;
    local_68 = 0;
    do {
      local_b8._0_4_ = 0;
      local_b8._4_4_ = 0;
      local_b8._8_8_ = (pointer)0x0;
      local_a8.obj = (Object *)0x0;
      std::
      vector<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>,std::allocator<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>>
      ::emplace_back<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>
                (local_70,(vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                          local_b8);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_b8);
      uVar7 = std::istream::get();
      uVar8 = std::istream::get();
      uVar9 = std::istream::get();
      iVar10 = std::istream::get();
      uVar7 = (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff;
      local_58 = CONCAT44(local_58._4_4_,uVar7);
      if (uVar7 != 0) {
        uVar7 = 0;
        local_60 = local_68 * 0x18;
        do {
          pvVar14 = (vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                    (*(long *)local_70 + local_60);
          uVar8 = std::istream::get();
          uVar9 = std::istream::get();
          uVar11 = std::istream::get();
          iVar10 = std::istream::get();
          Memory::GetVariable((Nullable<LiteScript::Variable> *)local_b8,memory,
                              (uVar11 & 0xff) << 0x10 | iVar10 << 0x18 |
                              (uVar9 & 0xff) << 8 | uVar8 & 0xff);
          Variable::Variable(&local_48,(Variable *)local_b8);
          std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
          emplace_back<LiteScript::Variable>(pvVar14,&local_48);
          Variable::~Variable(&local_48);
          if ((bool)(char)local_a8.obj == false) {
            Variable::~Variable((Variable *)local_b8);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (uint)local_58);
      }
      local_68 = local_68 + 1;
    } while (local_68 < local_38);
  }
  pvVar1 = &__return_storage_ptr__->ths;
  std::
  vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
  ::clear(pvVar1);
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  uVar9 = std::istream::get();
  iVar10 = std::istream::get();
  uVar7 = (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff;
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      iVar10 = std::istream::get();
      if (iVar10 == 0) {
        local_a8.obj = (Object *)CONCAT71(local_a8.obj._1_7_,true);
        local_a8.nb_ref = (uint *)&local_a8;
        std::
        vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
        ::emplace_back<LiteScript::Nullable<LiteScript::Variable>>
                  ((vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
                    *)pvVar1,(Nullable<LiteScript::Variable> *)local_b8);
      }
      else {
        uVar9 = std::istream::get();
        uVar11 = std::istream::get();
        uVar12 = std::istream::get();
        iVar10 = std::istream::get();
        Memory::GetVariable((Nullable<LiteScript::Variable> *)local_b8,memory,
                            (uVar12 & 0xff) << 0x10 | iVar10 << 0x18 |
                            (uVar11 & 0xff) << 8 | uVar9 & 0xff);
        std::
        vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
        ::emplace_back<LiteScript::Nullable<LiteScript::Variable>>
                  ((vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
                    *)pvVar1,(Nullable<LiteScript::Variable> *)local_b8);
      }
      if ((char)local_a8.obj == '\0') {
        Variable::~Variable((Variable *)local_b8);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar7);
  }
  pvVar1 = &__return_storage_ptr__->rets;
  std::
  vector<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
  ::clear(pvVar1);
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  uVar9 = std::istream::get();
  iVar10 = std::istream::get();
  uVar7 = (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff;
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      iVar10 = std::istream::get();
      if (iVar10 == 0) {
        local_a8.obj = (Object *)CONCAT71(local_a8.obj._1_7_,true);
        local_a8.nb_ref = (uint *)&local_a8;
        std::
        vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
        ::emplace_back<LiteScript::Nullable<LiteScript::Variable>>
                  ((vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
                    *)pvVar1,(Nullable<LiteScript::Variable> *)local_b8);
      }
      else {
        uVar9 = std::istream::get();
        uVar11 = std::istream::get();
        uVar12 = std::istream::get();
        iVar10 = std::istream::get();
        Memory::GetVariable((Nullable<LiteScript::Variable> *)local_b8,memory,
                            (uVar12 & 0xff) << 0x10 | iVar10 << 0x18 |
                            (uVar11 & 0xff) << 8 | uVar9 & 0xff);
        std::
        vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
        ::emplace_back<LiteScript::Nullable<LiteScript::Variable>>
                  ((vector<LiteScript::Nullable<LiteScript::Variable>,std::allocator<LiteScript::Nullable<LiteScript::Variable>>>
                    *)pvVar1,(Nullable<LiteScript::Variable> *)local_b8);
      }
      if ((char)local_a8.obj == '\0') {
        Variable::~Variable((Variable *)local_b8);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar7);
  }
  pVVar4 = (__return_storage_ptr__->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar5 = (__return_storage_ptr__->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pVVar4;
  if (pVVar5 != pVVar4) {
    do {
      Variable::~Variable(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pVVar5);
    (__return_storage_ptr__->op_lifo).
    super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar4;
  }
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  uVar9 = std::istream::get();
  iVar10 = std::istream::get();
  uVar7 = (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff;
  if (uVar7 != 0) {
    local_70 = (vector<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>,std::allocator<std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>>>
                *)&__return_storage_ptr__->op_lifo;
    uVar8 = 0;
    do {
      uVar9 = std::istream::get();
      uVar11 = std::istream::get();
      uVar12 = std::istream::get();
      iVar10 = std::istream::get();
      Memory::GetVariable((Nullable<LiteScript::Variable> *)local_b8,memory,
                          (uVar12 & 0xff) << 0x10 | iVar10 << 0x18 |
                          (uVar11 & 0xff) << 8 | uVar9 & 0xff);
      Variable::Variable(&local_48,(Variable *)local_b8);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
      emplace_back<LiteScript::Variable>
                ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_70,
                 &local_48);
      Variable::~Variable(&local_48);
      if ((bool)(char)local_a8.obj == false) {
        Variable::~Variable((Variable *)local_b8);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar7);
  }
  paVar6 = (__return_storage_ptr__->call_lifo).
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->call_lifo).
      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != paVar6) {
    (__return_storage_ptr__->call_lifo).
    super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = paVar6;
  }
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  uVar9 = std::istream::get();
  iVar10 = std::istream::get();
  uVar7 = (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff;
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      uVar9 = std::istream::get();
      uVar11 = std::istream::get();
      uVar12 = std::istream::get();
      iVar10 = std::istream::get();
      local_b8._0_4_ =
           (uVar12 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar11 & 0xff) << 8 | uVar9 & 0xff;
      uVar9 = std::istream::get();
      uVar11 = std::istream::get();
      uVar12 = std::istream::get();
      iVar10 = std::istream::get();
      local_b8._4_4_ =
           (uVar12 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar11 & 0xff) << 8 | uVar9 & 0xff;
      __position._M_current =
           (__return_storage_ptr__->call_lifo).
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->call_lifo).
          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>::
        _M_realloc_insert<std::array<unsigned_int,2ul>>
                  ((vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>
                    *)&__return_storage_ptr__->call_lifo,__position,
                   (array<unsigned_int,_2UL> *)local_b8);
      }
      else {
        *(undefined8 *)(__position._M_current)->_M_elems = local_b8._0_8_;
        ppaVar2 = &(__return_storage_ptr__->call_lifo).
                   super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar2 = *ppaVar2 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar7);
  }
  this = &__return_storage_ptr__->nsp_lifo;
  std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::_M_erase_at_end
            (this,(__return_storage_ptr__->nsp_lifo).
                  super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
                  super__Vector_impl_data._M_start);
  uVar7 = std::istream::get();
  uVar8 = std::istream::get();
  uVar9 = std::istream::get();
  iVar10 = std::istream::get();
  uVar7 = (uVar9 & 0xff) << 0x10 | iVar10 << 0x18 | (uVar8 & 0xff) << 8 | uVar7 & 0xff;
  if (uVar7 != 0) {
    lVar15 = 0;
    uVar16 = 0;
    do {
      Namer::Namer((Namer *)local_b8,local_50);
      std::vector<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>::
      emplace_back<LiteScript::Namer>(this,(Namer *)local_b8);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector(&local_88);
      if (local_98 == false) {
        Variable::~Variable(&local_a8);
      }
      local_98 = true;
      Variable::~Variable((Variable *)local_b8);
      Namer::LoadIDs((Namer *)((((this->
                                 super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->current).data +
                              lVar15 + -0x10),stream);
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0x48;
    } while (uVar16 < uVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

LiteScript::State LiteScript::State::Load(std::istream &stream, Memory &memory) {
    State state(memory);
    state.instr_index = IStreamer::Read<unsigned int>(stream);
    state.line_num = IStreamer::Read<unsigned int>(stream);
    std::allocator<Variable> allocator;
    allocator.destroy(&state.nsp_global);
    allocator.construct(&state.nsp_global, memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    state.args_tmp.clear();
    for (unsigned int i = 0, sz_i = IStreamer::Read<unsigned int>(stream); i < sz_i; i++) {
        state.args_tmp.push_back(std::vector<Variable>());
        for (unsigned int j = 0, sz_j = IStreamer::Read<unsigned int>(stream); j < sz_j; j++)
            state.args_tmp[i].push_back(memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    }
    state.args_tmp.clear();
    for (unsigned int i = 0, sz_i = IStreamer::Read<unsigned int>(stream); i < sz_i; i++) {
        state.args_def.push_back(std::vector<Variable>());
        for (unsigned int j = 0, sz_j = IStreamer::Read<unsigned int>(stream); j < sz_j; j++)
            state.args_def[i].push_back(memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    }
    state.ths.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++) {
        if (stream.get() == 0)
            state.ths.push_back(Nullable<Variable>());
        else
            state.ths.push_back(Nullable<Variable>(memory.GetVariable(IStreamer::Read<unsigned int>(stream))));
    }
    state.rets.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++) {
        if (stream.get() == 0)
            state.rets.push_back(Nullable<Variable>());
        else
            state.rets.push_back(Nullable<Variable>(memory.GetVariable(IStreamer::Read<unsigned int>(stream))));
    }
    state.op_lifo.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++)
        state.op_lifo.push_back(memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
    state.call_lifo.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++)
        state.call_lifo.push_back({ IStreamer::Read<unsigned int>(stream), IStreamer::Read<unsigned int>(stream) });
    state.nsp_lifo.clear();
    for (unsigned int i = 0, sz = IStreamer::Read<unsigned int>(stream); i < sz; i++) {
        state.nsp_lifo.push_back(Namer(state.nsp_global));
        state.nsp_lifo[i].LoadIDs(stream);
    }
    return state;
}